

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser14.cpp
# Opt level: O0

LibraryMaterialsLoader * __thiscall
COLLADASaxFWL::RootParser14::
beginCommonWithId<COLLADASaxFWL::LibraryMaterialsLoader,COLLADASaxFWL::LibraryMaterialsLoader14>
          (RootParser14 *this,char *id)

{
  LibraryMaterialsLoader *this_00;
  IParserImpl *parserImpl;
  long in_RDI;
  LibraryMaterialsLoader14 *loader14;
  LibraryMaterialsLoader *loader;
  LibraryMaterialsLoader *in_stack_ffffffffffffff98;
  LibraryMaterialsLoader *in_stack_ffffffffffffffa0;
  IParserImpl *local_50;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryMaterialsLoader *)operator_new(0x30);
  LibraryMaterialsLoader::LibraryMaterialsLoader
            (in_stack_ffffffffffffffa0,(IFilePartLoader *)in_stack_ffffffffffffff98);
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryMaterialsLoader14::LibraryMaterialsLoader14
            ((LibraryMaterialsLoader14 *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader(*(IFilePartLoader **)(in_RDI + 0x20),(IFilePartLoader *)this_00);
  local_50 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    local_50 = parserImpl + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x48))(*(long **)(in_RDI + 0x20),local_50);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser14::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader14* loader14 = new Loader14(loader);
		loader->setParserImpl( loader14 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader14);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}